

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

string * __thiscall
helics::HandleManager::generateName_abi_cxx11_
          (string *__return_storage_ptr__,HandleManager *this,InterfaceType what)

{
  _Map_pointer ppBVar1;
  bool bVar2;
  uint uVar3;
  char *__s;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000011;
  uint uVar6;
  size_type __len2;
  ulong __val;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar5 = (int)CONCAT71(in_register_00000011,what);
  if (iVar5 < 0x70) {
    if (iVar5 == 0x65) {
      __len2 = 5;
      __s = "_ept_";
      goto LAB_00358e44;
    }
    if (iVar5 == 0x66) {
      __len2 = 8;
      __s = "_filter_";
      goto LAB_00358e44;
    }
    if (iVar5 == 0x69) {
      __len2 = 7;
      __s = "_input_";
      goto LAB_00358e44;
    }
  }
  else {
    if (iVar5 == 0x70) {
      __len2 = 5;
      __s = "_pub_";
      goto LAB_00358e44;
    }
    if (iVar5 == 0x73) {
      __len2 = 6;
      __s = "_sink_";
      goto LAB_00358e44;
    }
    if (iVar5 == 0x74) {
      __len2 = 0xc;
      __s = "_translator_";
      goto LAB_00358e44;
    }
  }
  __len2 = 8;
  __s = "_handle_";
LAB_00358e44:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,0,0,__s,__len2);
  ppBVar1 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  __val = ((long)(this->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x79435e50d79435e5 +
          ((long)(this->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x79435e50d79435e5 +
          (((long)ppBVar1 -
            (long)(this->handles).
                  super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppBVar1 == (_Map_pointer)0x0)) * 3;
  uVar6 = 1;
  if (9 < __val) {
    uVar4 = __val;
    uVar3 = 4;
    do {
      uVar6 = uVar3;
      if (uVar4 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_00358ef5;
      }
      if (uVar4 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_00358ef5;
      }
      if (uVar4 < 10000) goto LAB_00358ef5;
      bVar2 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      uVar3 = uVar6 + 4;
    } while (bVar2);
    uVar6 = uVar6 + 1;
  }
LAB_00358ef5:
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_48,(ulong)uVar6,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,__val);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,local_48._M_dataplus._M_p,
             CONCAT44(local_48._M_string_length._4_4_,(uint)local_48._M_string_length));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HandleManager::generateName(InterfaceType what) const
{
    std::string base;
    switch (what) {
        case InterfaceType::ENDPOINT:
            base = "_ept_";
            break;
        case InterfaceType::INPUT:
            base = "_input_";
            break;
        case InterfaceType::PUBLICATION:
            base = "_pub_";
            break;
        case InterfaceType::FILTER:
            base = "_filter_";
            break;
        case InterfaceType::TRANSLATOR:
            base = "_translator_";
            break;
        case InterfaceType::SINK:
            base = "_sink_";
            break;
        default:
            base = "_handle_";
            break;
    }
    base.append(std::to_string(handles.size()));
    return base;
}